

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

size_t __thiscall
kj::_::BTreeImpl::verifyNode
          (BTreeImpl *this,size_t size,FunctionParam<bool_(unsigned_int,_unsigned_int)> *f,uint pos,
          uint height,MaybeUint maxRow)

{
  NodeUnion *pNVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  uint n;
  uint i;
  Fault f_1;
  MaybeUint maxRow_local;
  size_t size_local;
  DebugComparison<unsigned_int,_unsigned_long_&> _kjCondition;
  
  pNVar1 = this->tree;
  maxRow_local.i = maxRow.i;
  size_local = size;
  if (height == 0) {
    iVar6 = 7;
    if (pNVar1[pos].field_0.freelist.zero[7] == 0) {
      iVar6 = 0;
    }
    uVar3 = (uint)(*(int *)((long)&pNVar1[pos].field_0 + (ulong)(uint)(iVar6 * 4) + 0x14) != 0);
    iVar5 = iVar6 + uVar3 * 4;
    bVar10 = *(int *)((long)&pNVar1[pos].field_0 + (ulong)(uint)(iVar5 * 4) + 0xc) != 0;
    uVar7 = iVar5 + (uint)bVar10 * 2;
    uVar4 = (uint)(*(int *)((long)&pNVar1[pos].field_0 + (ulong)uVar7 * 4 + 8) != 0);
    n = uVar7 + uVar4;
    if (n != 0) {
      lVar8 = 0;
      do {
        i = (uint)lVar8;
        uVar7 = *(int *)((long)&pNVar1[pos].field_0 + lVar8 * 4 + 8) - 1;
        _kjCondition.left = uVar7;
        _kjCondition.op.content.ptr = " < ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = uVar7 < size_local;
        _kjCondition.right = &size_local;
        if (size_local <= uVar7) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int&,unsigned_int&>
                    (&f_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xc2,FAILED,"*leaf.rows[i] < size","_kjCondition,n, i",&_kjCondition,&n,&i);
          Debug::Fault::fatal(&f_1);
        }
        if ((i != 0) &&
           (f_1.exception._0_1_ =
                 (*(code *)**(undefined8 **)f->space)
                           (f,*(int *)((long)&pNVar1[pos].field_0 + (ulong)(i - 1) * 4 + 8) + -1,
                            *(int *)((long)&pNVar1[pos].field_0 + lVar8 * 4 + 8) + -1),
           (char)f_1.exception == '\0')) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xc5,FAILED,"f(*leaf.rows[i - 1], *leaf.rows[i])",
                     "_kjCondition,n, i, leaf.rows[i - 1], leaf.rows[i]",
                     (DebugExpression<bool> *)&f_1,&n,&i,
                     (MaybeUint *)((long)&pNVar1[pos].field_0 + (ulong)(i - 1) * 4 + 8),
                     (MaybeUint *)((long)&pNVar1[pos].field_0 + (ulong)i * 4 + 8));
          Debug::Fault::fatal((Fault *)&_kjCondition);
        }
        lVar8 = lVar8 + 1;
      } while ((uint)bVar10 * 2 + iVar6 + uVar3 * 4 + uVar4 != (int)lVar8);
    }
    if (maxRow_local.i != 0) {
      _kjCondition._0_8_ = (long)&pNVar1[pos].field_0 + (ulong)(n - 1) * 4 + 8;
      _kjCondition.result = *(uint *)_kjCondition._0_8_ == maxRow_local.i;
      _kjCondition.right = (unsigned_long *)&maxRow_local;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if (!_kjCondition.result) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>&,unsigned_int&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xc9,FAILED,"leaf.rows[n-1] == maxRow","_kjCondition,n",
                   (DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_kj::_::BTreeImpl::MaybeUint_&> *)
                   &_kjCondition,&n);
        Debug::Fault::fatal(&f_1);
      }
    }
    sVar2 = (size_t)n;
  }
  else {
    bVar10 = pNVar1[pos].field_0.freelist.zero[3] != 0;
    iVar6 = (uint)bVar10 * 4;
    bVar10 = *(int *)((long)&pNVar1[pos].field_0 + (ulong)bVar10 * 0x10 + 8) != 0;
    uVar4 = iVar6 + (uint)bVar10 * 2;
    uVar3 = (uint)(*(int *)((long)&pNVar1[pos].field_0 + (ulong)uVar4 * 4 + 4) != 0);
    n = uVar4 | uVar3;
    if (n == 0) {
      lVar8 = 0;
    }
    else {
      lVar9 = 0;
      lVar8 = 0;
      do {
        i = (uint)lVar9;
        uVar4 = *(int *)((long)&pNVar1[pos].field_0 + lVar9 * 4 + 4) - 1;
        _kjCondition.left = uVar4;
        _kjCondition.right = &size_local;
        _kjCondition.op.content.ptr = " < ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = uVar4 < size_local;
        if (size_local <= uVar4) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int&,unsigned_int&>
                    (&f_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xb2,FAILED,"*parent.keys[i] < size","_kjCondition,n, i",&_kjCondition,&n,&i);
          Debug::Fault::fatal(&f_1);
        }
        sVar2 = verifyNode(this,size_local,f,
                           *(uint *)((long)&pNVar1[pos].field_0 + lVar9 * 4 + 0x20),height - 1,
                           (MaybeUint)*(uint *)((long)&pNVar1[pos].field_0 + lVar9 * 4 + 4));
        if (((ulong)i != 0) &&
           (f_1.exception._0_1_ =
                 (*(code *)**(undefined8 **)f->space)
                           (f,*(int *)((long)&pNVar1[pos].field_0 + (ulong)(i - 1) * 4 + 4) + -1,
                            *(int *)((long)&pNVar1[pos].field_0 + (ulong)i * 4 + 4) + -1),
           (char)f_1.exception == '\0')) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xb6,FAILED,"f(*parent.keys[i - 1], *parent.keys[i])",
                     "_kjCondition,n, i, parent.keys[i - 1], parent.keys[i]",
                     (DebugExpression<bool> *)&f_1,&n,&i,
                     (MaybeUint *)((long)&pNVar1[pos].field_0 + (ulong)(i - 1) * 4 + 4),
                     (MaybeUint *)((long)&pNVar1[pos].field_0 + (ulong)i * 4 + 4));
          Debug::Fault::fatal((Fault *)&_kjCondition);
        }
        lVar8 = lVar8 + sVar2;
        lVar9 = lVar9 + 1;
      } while (iVar6 + (uint)bVar10 * 2 + uVar3 != (int)lVar9);
    }
    sVar2 = verifyNode(this,size_local,f,*(uint *)((long)&pNVar1[pos].field_0 + (ulong)n * 4 + 0x20)
                       ,height - 1,maxRow_local);
    if ((maxRow_local.i != 0) &&
       (f_1.exception._0_1_ =
             (*(code *)**(undefined8 **)f->space)
                       (f,*(int *)((long)&pNVar1[pos].field_0 + (ulong)(n - 1) * 4 + 4) + -1,
                        maxRow_local.i - 1), (char)f_1.exception == '\0')) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0xbb,FAILED,"f(*parent.keys[n-1], *maxRow)",
                 "_kjCondition,n, parent.keys[n-1], maxRow",(DebugExpression<bool> *)&f_1,&n,
                 (MaybeUint *)((long)&pNVar1[pos].field_0 + (ulong)(n - 1) * 4 + 4),&maxRow_local);
      Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    sVar2 = sVar2 + lVar8;
  }
  return sVar2;
}

Assistant:

size_t BTreeImpl::verifyNode(size_t size, FunctionParam<bool(uint, uint)>& f,
                             uint pos, uint height, MaybeUint maxRow) {
  if (height > 0) {
    auto& parent = tree[pos].parent;

    auto n = parent.keyCount();
    size_t total = 0;
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*parent.keys[i] < size, n, i);
      total += verifyNode(size, f, parent.children[i], height - 1, parent.keys[i]);
      if (i > 0) {
        KJ_ASSERT(f(*parent.keys[i - 1], *parent.keys[i]),
            n, i, parent.keys[i - 1], parent.keys[i]);
      }
    }
    total += verifyNode(size, f, parent.children[n], height - 1, maxRow);
    if (maxRow != nullptr) {
      KJ_ASSERT(f(*parent.keys[n-1], *maxRow), n, parent.keys[n-1], maxRow);
    }
    return total;
  } else {
    auto& leaf = tree[pos].leaf;
    auto n = leaf.size();
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*leaf.rows[i] < size, n, i);
      if (i > 0) {
        KJ_ASSERT(f(*leaf.rows[i - 1], *leaf.rows[i]),
            n, i, leaf.rows[i - 1], leaf.rows[i]);
      }
    }
    if (maxRow != nullptr) {
      KJ_ASSERT(leaf.rows[n-1] == maxRow, n);
    }
    return n;
  }
}